

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

void __thiscall
LNodeIStmt::LNodeIStmt(LNodeIStmt *this,shared_ptr<LNode> *condition,shared_ptr<LNode> *then_branch)

{
  shared_ptr<LNode> *then_branch_local;
  shared_ptr<LNode> *condition_local;
  LNodeIStmt *this_local;
  
  std::shared_ptr<LNode>::shared_ptr(&this->condition);
  std::shared_ptr<LNode>::shared_ptr(&this->then_branch);
  std::shared_ptr<LNode>::operator=(&this->condition,condition);
  std::shared_ptr<LNode>::operator=(&this->then_branch,then_branch);
  return;
}

Assistant:

LNodeIStmt(std::shared_ptr<LNode> condition, std::shared_ptr<LNode> then_branch) {
        this->condition = std::move(condition);
        this->then_branch = std::move(then_branch);
    }